

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O3

char * luaX_token2str(LexState *ls,int token)

{
  char *pcVar1;
  
  if (token < 0x101) {
    pcVar1 = luaO_pushfstring(ls->L,"\'%c\'");
    return pcVar1;
  }
  if ((uint)token < 0x121) {
    pcVar1 = luaO_pushfstring(ls->L,"\'%s\'",luaX_tokens[token - 0x101]);
    return pcVar1;
  }
  return luaX_tokens[token - 0x101];
}

Assistant:

const char *luaX_token2str (LexState *ls, int token) {
  if (token < FIRST_RESERVED) {  /* single-byte symbols? */
    lua_assert(token == cast_uchar(token));
    return luaO_pushfstring(ls->L, "'%c'", token);
  }
  else {
    const char *s = luaX_tokens[token - FIRST_RESERVED];
    if (token < TK_EOS)  /* fixed format (symbols and reserved words)? */
      return luaO_pushfstring(ls->L, "'%s'", s);
    else  /* names, strings, and numerals */
      return s;
  }
}